

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::ConstPixelBufferAccess::getPixel(ConstPixelBufferAccess *this,int x,int y,int z)

{
  Channel CVar1;
  uint x_;
  uint y_;
  uint z_;
  uint w_;
  int iVar2;
  TextureSwizzle *pTVar3;
  float *pfVar4;
  undefined4 in_register_00000034;
  ConstPixelBufferAccess *this_00;
  int in_R8D;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  ulong uVar9;
  undefined8 in_XMM1_Qa;
  undefined8 uVar10;
  Vec4 VVar11;
  Vec4 VVar12;
  Vec4 VVar13;
  int local_170;
  int c;
  int channelSize;
  Channel *channelMap;
  Float<unsigned_int,_5,_6,_15,_2U> local_158;
  Float<unsigned_int,_5,_6,_15,_2U> local_154;
  Vector<float,_4> local_150;
  Vector<unsigned_int,_4> local_140;
  tcu local_130 [16];
  Vector<unsigned_int,_4> local_120;
  tcu local_110 [16];
  Vector<float,_4> local_100;
  Vector<float,_4> local_f0;
  Vector<unsigned_int,_4> local_e0;
  tcu local_d0 [16];
  Vector<float,_4> local_c0;
  Vector<unsigned_int,_4> local_b0;
  tcu local_a0 [16];
  Vector<float,_4> local_90;
  Vector<float,_4> local_80;
  Vector<unsigned_int,_4> local_70;
  tcu local_60 [16];
  Vector<float,_4> local_50;
  Vector<unsigned_int,_4> local_40;
  uint *local_30;
  deUint8 *pixelPtr;
  int local_20;
  int z_local;
  int y_local;
  int x_local;
  ConstPixelBufferAccess *this_local;
  Vec4 *result;
  Vec4 VVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  
  this_00 = (ConstPixelBufferAccess *)CONCAT44(in_register_00000034,x);
  local_20 = z;
  z_local = y;
  _y_local = this_00;
  this_local = this;
  local_30 = (uint *)getPixelPtr(this_00,y,z,in_R8D);
  if ((this_00->m_format).type == UNORM_INT8) {
    if (((this_00->m_format).order == RGBA) || ((this_00->m_format).order == sRGBA)) {
      VVar11 = anon_unknown_75::readRGBA8888Float((anon_unknown_75 *)this,(deUint8 *)local_30);
      VVar11.m_data[0] = VVar11.m_data[0];
      auVar17._4_4_ = VVar11.m_data[1];
      register0x00001240 = VVar11.m_data[2];
      register0x00001244 = VVar11.m_data[3];
      return (Vec4)VVar11.m_data;
    }
    if (((this_00->m_format).order == RGB) || ((this_00->m_format).order == sRGB)) {
      VVar11 = anon_unknown_75::readRGB888Float((anon_unknown_75 *)this,(deUint8 *)local_30);
      VVar14.m_data[0] = VVar11.m_data[0];
      auVar16._4_4_ = VVar11.m_data[1];
      register0x00001240 = VVar11.m_data[2];
      register0x00001244 = VVar11.m_data[3];
      return (Vec4)VVar14.m_data;
    }
  }
  switch((this_00->m_format).type) {
  case UNORM_BYTE_44:
    fVar8 = anon_unknown_75::channelToUnormFloat((int)(uint)(byte)*local_30 >> 4,4);
    fVar6 = anon_unknown_75::channelToUnormFloat((byte)*local_30 & 0xf,4);
    uVar10 = CONCAT44(extraout_XMM0_Db,fVar6);
    Vector<float,_4>::Vector((Vector<float,_4> *)this,fVar8,fVar6,0.0,1.0);
    VVar12.m_data[2] = (float)(int)uVar10;
    VVar12.m_data[3] = (float)(int)((ulong)uVar10 >> 0x20);
    VVar12.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar12.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    break;
  case UNORM_SHORT_565:
    fVar8 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 0xb,5);
    fVar6 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 5 & 0x3f,6);
    fVar7 = anon_unknown_75::channelToUnormFloat((ushort)*local_30 & 0x1f,5);
    Vector<float,_4>::Vector(&local_50,fVar8,fVar6,fVar7,1.0);
    VVar12.m_data =
         (float  [4])swizzleRB<float>((tcu *)this,&local_50,(this_00->m_format).order,RGB);
    break;
  case UNORM_SHORT_555:
    fVar8 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 10 & 0x1f,5);
    fVar6 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 5 & 0x1f,5);
    fVar7 = anon_unknown_75::channelToUnormFloat((ushort)*local_30 & 0x1f,5);
    Vector<float,_4>::Vector(&local_80,fVar8,fVar6,fVar7,1.0);
    VVar12.m_data =
         (float  [4])swizzleRB<float>((tcu *)this,&local_80,(this_00->m_format).order,RGB);
    break;
  case UNORM_SHORT_4444:
    fVar8 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 0xc,4);
    fVar6 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 8 & 0xf,4);
    fVar7 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 4 & 0xf,4);
    fVar5 = anon_unknown_75::channelToUnormFloat((ushort)*local_30 & 0xf,4);
    Vector<float,_4>::Vector(&local_90,fVar8,fVar6,fVar7,fVar5);
    VVar12.m_data =
         (float  [4])swizzleRB<float>((tcu *)this,&local_90,(this_00->m_format).order,RGBA);
    break;
  case UNORM_SHORT_5551:
    fVar8 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 0xb,5);
    fVar6 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 6 & 0x1f,5);
    fVar7 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 1 & 0x1f,5);
    fVar5 = anon_unknown_75::channelToUnormFloat((ushort)*local_30 & 1,1);
    Vector<float,_4>::Vector(&local_c0,fVar8,fVar6,fVar7,fVar5);
    VVar12.m_data =
         (float  [4])swizzleRB<float>((tcu *)this,&local_c0,(this_00->m_format).order,RGBA);
    break;
  case UNORM_SHORT_1555:
    fVar8 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 0xf,1);
    fVar6 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 10 & 0x1f,5);
    fVar7 = anon_unknown_75::channelToUnormFloat((int)(uint)(ushort)*local_30 >> 5 & 0x1f,5);
    fVar5 = anon_unknown_75::channelToUnormFloat((ushort)*local_30 & 0x1f,5);
    Vector<float,_4>::Vector(&local_150,fVar8,fVar6,fVar7,fVar5);
    VVar12.m_data =
         (float  [4])Vector<float,_4>::swizzle((Vector<float,_4> *)this,(int)&local_150,1,2,3);
    break;
  case UNORM_INT_101010:
    fVar8 = anon_unknown_75::channelToUnormFloat(*local_30 >> 0x16,10);
    fVar6 = anon_unknown_75::channelToUnormFloat(*local_30 >> 0xc & 0x3ff,10);
    fVar7 = anon_unknown_75::channelToUnormFloat(*local_30 >> 2 & 0x3ff,10);
    uVar9 = (ulong)(uint)fVar6;
    Vector<float,_4>::Vector((Vector<float,_4> *)this,fVar8,fVar6,fVar7,1.0);
    VVar12.m_data[2] = (float)(int)uVar9;
    VVar12.m_data[3] = (float)(int)(uVar9 >> 0x20);
    VVar12.m_data[0] = (float)(int)extraout_XMM0_Qa_00;
    VVar12.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    break;
  case SNORM_INT_1010102_REV:
    fVar8 = anon_unknown_75::channelToSnormFloat(*local_30 & 0x3ff,10);
    fVar6 = anon_unknown_75::channelToSnormFloat(*local_30 >> 10 & 0x3ff,10);
    fVar7 = anon_unknown_75::channelToSnormFloat(*local_30 >> 0x14 & 0x3ff,10);
    fVar5 = anon_unknown_75::channelToSnormFloat(*local_30 >> 0x1e,2);
    Vector<float,_4>::Vector(&local_100,fVar8,fVar6,fVar7,fVar5);
    VVar12.m_data =
         (float  [4])swizzleRB<float>((tcu *)this,&local_100,(this_00->m_format).order,RGBA);
    break;
  case UNORM_INT_1010102_REV:
    fVar8 = anon_unknown_75::channelToUnormFloat(*local_30 & 0x3ff,10);
    fVar6 = anon_unknown_75::channelToUnormFloat(*local_30 >> 10 & 0x3ff,10);
    fVar7 = anon_unknown_75::channelToUnormFloat(*local_30 >> 0x14 & 0x3ff,10);
    fVar5 = anon_unknown_75::channelToUnormFloat(*local_30 >> 0x1e,2);
    Vector<float,_4>::Vector(&local_f0,fVar8,fVar6,fVar7,fVar5);
    VVar12.m_data =
         (float  [4])swizzleRB<float>((tcu *)this,&local_f0,(this_00->m_format).order,RGBA);
    break;
  case UNSIGNED_BYTE_44:
    Vector<unsigned_int,_4>::Vector
              (&local_40,(int)(uint)(byte)*local_30 >> 4,(byte)*local_30 & 0xf,0,1);
    VVar12.m_data =
         (float  [4])Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
    break;
  case UNSIGNED_SHORT_565:
    Vector<unsigned_int,_4>::Vector
              (&local_70,(int)(uint)(ushort)*local_30 >> 0xb,
               (int)(uint)(ushort)*local_30 >> 5 & 0x3f,(ushort)*local_30 & 0x1f,1);
    swizzleRB<unsigned_int>(local_60,&local_70,(this_00->m_format).order,RGB);
    VVar12.m_data =
         (float  [4])Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
    break;
  case UNSIGNED_SHORT_4444:
    Vector<unsigned_int,_4>::Vector
              (&local_b0,(int)(uint)(ushort)*local_30 >> 0xc,(int)(uint)(ushort)*local_30 >> 8 & 0xf
               ,(int)(uint)(ushort)*local_30 >> 4 & 0xf,(ushort)*local_30 & 0xf);
    swizzleRB<unsigned_int>(local_a0,&local_b0,(this_00->m_format).order,RGBA);
    VVar12.m_data =
         (float  [4])Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
    break;
  case UNSIGNED_SHORT_5551:
    Vector<unsigned_int,_4>::Vector
              (&local_e0,(int)(uint)(ushort)*local_30 >> 0xb,
               (int)(uint)(ushort)*local_30 >> 6 & 0x1f,(int)(uint)(ushort)*local_30 >> 1 & 0x1f,
               (ushort)*local_30 & 1);
    swizzleRB<unsigned_int>(local_d0,&local_e0,(this_00->m_format).order,RGBA);
    VVar12.m_data =
         (float  [4])Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
    break;
  case SIGNED_INT_1010102_REV:
    x_ = anon_unknown_75::signExtend(*local_30 & 0x3ff,10);
    y_ = anon_unknown_75::signExtend(*local_30 >> 10 & 0x3ff,10);
    z_ = anon_unknown_75::signExtend(*local_30 >> 0x14 & 0x3ff,10);
    w_ = anon_unknown_75::signExtend(*local_30 >> 0x1e,2);
    Vector<unsigned_int,_4>::Vector(&local_140,x_,y_,z_,w_);
    swizzleRB<unsigned_int>(local_130,&local_140,(this_00->m_format).order,RGBA);
    VVar12.m_data =
         (float  [4])Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
    break;
  case UNSIGNED_INT_1010102_REV:
    Vector<unsigned_int,_4>::Vector
              (&local_120,*local_30 & 0x3ff,*local_30 >> 10 & 0x3ff,*local_30 >> 0x14 & 0x3ff,
               *local_30 >> 0x1e);
    swizzleRB<unsigned_int>(local_110,&local_120,(this_00->m_format).order,RGBA);
    VVar12.m_data =
         (float  [4])Vector<unsigned_int,_4>::cast<float>((Vector<unsigned_int,_4> *)this);
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    Float<unsigned_int,_5,_6,_15,_2U>::Float(&local_154,*local_30 & 0x7ff);
    fVar8 = Float<unsigned_int,_5,_6,_15,_2U>::asFloat(&local_154);
    Float<unsigned_int,_5,_6,_15,_2U>::Float(&local_158,*local_30 >> 0xb & 0x7ff);
    fVar6 = Float<unsigned_int,_5,_6,_15,_2U>::asFloat(&local_158);
    Float<unsigned_int,_5,_5,_15,_2U>::Float
              ((Float<unsigned_int,_5,_5,_15,_2U> *)((long)&channelMap + 4),*local_30 >> 0x16);
    fVar7 = Float<unsigned_int,_5,_5,_15,_2U>::asFloat
                      ((Float<unsigned_int,_5,_5,_15,_2U> *)((long)&channelMap + 4));
    uVar9 = (ulong)(uint)fVar6;
    Vector<float,_4>::Vector((Vector<float,_4> *)this,fVar8,fVar6,fVar7,1.0);
    VVar12.m_data[2] = (float)(int)uVar9;
    VVar12.m_data[3] = (float)(int)(uVar9 >> 0x20);
    VVar12.m_data[0] = (float)(int)extraout_XMM0_Qa_01;
    VVar12.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    break;
  case UNSIGNED_INT_999_E5_REV:
    VVar12 = anon_unknown_75::unpackRGB999E5((anon_unknown_75 *)this,*local_30);
    break;
  default:
    Vector<float,_4>::Vector((Vector<float,_4> *)this);
    pTVar3 = getChannelReadSwizzle((this_00->m_format).order);
    iVar2 = getChannelSize((this_00->m_format).type);
    uVar9 = extraout_XMM0_Qa_02;
    for (local_170 = 0; VVar12.m_data[2] = (float)(int)in_XMM1_Qa,
        VVar12.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20),
        VVar12.m_data[0] = (float)(int)uVar9, VVar12.m_data[1] = (float)(int)(uVar9 >> 0x20),
        local_170 < 4; local_170 = local_170 + 1) {
      CVar1 = pTVar3->components[local_170];
      if (CVar1 < CHANNEL_ZERO) {
        fVar8 = anon_unknown_75::channelToFloat
                          ((byte *)((long)local_30 +
                                   (long)(int)(iVar2 * pTVar3->components[local_170])),
                           (this_00->m_format).type);
        pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_170);
        uVar9 = (ulong)(uint)fVar8;
        *pfVar4 = fVar8;
      }
      else if (CVar1 == CHANNEL_ZERO) {
        pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_170);
        uVar9 = 0;
        *pfVar4 = 0.0;
      }
      else if (CVar1 == CHANNEL_ONE) {
        pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_170);
        uVar9 = 0x3f800000;
        *pfVar4 = 1.0;
      }
    }
  }
  VVar13.m_data[0] = VVar12.m_data[0];
  auVar15._4_4_ = VVar12.m_data[1];
  register0x00001240 = VVar12.m_data[2];
  register0x00001244 = VVar12.m_data[3];
  return (Vec4)VVar13.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::getPixel (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, m_size.x()));
	DE_ASSERT(de::inBounds(y, 0, m_size.y()));
	DE_ASSERT(de::inBounds(z, 0, m_size.z()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	const deUint8* pixelPtr = (const deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
			return readRGBA8888Float(pixelPtr);
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
			return readRGB888Float(pixelPtr);
	}

#define UI8(OFFS, COUNT)		((*((const deUint8*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define UI16(OFFS, COUNT)		((*((const deUint16*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define UI32(OFFS, COUNT)		((*((const deUint32*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define SI32(OFFS, COUNT)		signExtend(UI32(OFFS, COUNT), (COUNT))
#define UN8(OFFS, COUNT)		channelToUnormFloat(UI8 (OFFS, COUNT), (COUNT))
#define UN16(OFFS, COUNT)		channelToUnormFloat(UI16(OFFS, COUNT), (COUNT))
#define UN32(OFFS, COUNT)		channelToUnormFloat(UI32(OFFS, COUNT), (COUNT))
#define SN32(OFFS, COUNT)		channelToSnormFloat(UI32(OFFS, COUNT), (COUNT))

	// Packed formats.
	switch (m_format.type)
	{
		case TextureFormat::UNORM_BYTE_44:				return			  Vec4(UN8 (4,   4), UN8 ( 0,  4), 0.0f, 1.0f);
		case TextureFormat::UNSIGNED_BYTE_44:			return			 UVec4(UI8 (4,   4), UI8 ( 0,  4), 0u, 1u).cast<float>();
		case TextureFormat::UNORM_SHORT_565:			return swizzleRB( Vec4(UN16(11,  5), UN16( 5,  6), UN16( 0,  5), 1.0f), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNSIGNED_SHORT_565:			return swizzleRB(UVec4(UI16(11,  5), UI16( 5,  6), UI16( 0,  5), 1u), m_format.order, TextureFormat::RGB).cast<float>();
		case TextureFormat::UNORM_SHORT_555:			return swizzleRB( Vec4(UN16(10,  5), UN16( 5,  5), UN16( 0,  5), 1.0f), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNORM_SHORT_4444:			return swizzleRB( Vec4(UN16(12,  4), UN16( 8,  4), UN16( 4,  4), UN16( 0, 4)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_4444:		return swizzleRB(UVec4(UI16(12,  4), UI16( 8,  4), UI16( 4,  4), UI16( 0, 4)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNORM_SHORT_5551:			return swizzleRB( Vec4(UN16(11,  5), UN16( 6,  5), UN16( 1,  5), UN16( 0, 1)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_5551:		return swizzleRB(UVec4(UI16(11,  5), UI16( 6,  5), UI16( 1,  5), UI16( 0, 1)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNORM_INT_101010:			return			  Vec4(UN32(22, 10), UN32(12, 10), UN32( 2, 10), 1.0f);
		case TextureFormat::UNORM_INT_1010102_REV:		return swizzleRB( Vec4(UN32( 0, 10), UN32(10, 10), UN32(20, 10), UN32(30, 2)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::SNORM_INT_1010102_REV:		return swizzleRB( Vec4(SN32( 0, 10), SN32(10, 10), SN32(20, 10), SN32(30, 2)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_INT_1010102_REV:	return swizzleRB( UVec4(UI32(0, 10), UI32(10, 10), UI32(20, 10), UI32(30, 2)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::SIGNED_INT_1010102_REV:		return swizzleRB( UVec4(SI32(0, 10), SI32(10, 10), SI32(20, 10), SI32(30, 2)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNSIGNED_INT_999_E5_REV:	return unpackRGB999E5(*((const deUint32*)pixelPtr));

		case TextureFormat::UNORM_SHORT_1555:
			DE_ASSERT(m_format.order == TextureFormat::ARGB);
			return Vec4(UN16(15, 1), UN16(10, 5), UN16(5, 5), UN16(0, 5)).swizzle(1,2,3,0); // ARGB -> RGBA

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
			return Vec4(Float11(UI32(0, 11)).asFloat(), Float11(UI32(11, 11)).asFloat(), Float10(UI32(22, 10)).asFloat(), 1.0f);

		default:
			break;
	}

#undef UN8
#undef UN16
#undef UN32
#undef SN32
#undef SI32
#undef UI8
#undef UI16
#undef UI32

	// Generic path.
	Vec4							result;
	const TextureSwizzle::Channel*	channelMap	= getChannelReadSwizzle(m_format.order).components;
	int								channelSize	= getChannelSize(m_format.type);

	for (int c = 0; c < 4; c++)
	{
		switch (channelMap[c])
		{
			case TextureSwizzle::CHANNEL_0:
			case TextureSwizzle::CHANNEL_1:
			case TextureSwizzle::CHANNEL_2:
			case TextureSwizzle::CHANNEL_3:
				result[c] = channelToFloat(pixelPtr + channelSize*((int)channelMap[c]), m_format.type);
				break;

			case TextureSwizzle::CHANNEL_ZERO:
				result[c] = 0.0f;
				break;

			case TextureSwizzle::CHANNEL_ONE:
				result[c] = 1.0f;
				break;

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}